

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QXmlStreamAttribute>::copyAppend
          (QGenericArrayOps<QXmlStreamAttribute> *this,QXmlStreamAttribute *b,QXmlStreamAttribute *e
          )

{
  QXmlStreamAttribute *pQVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QXmlStreamAttribute>).ptr;
    lVar3 = (this->super_QArrayDataPointer<QXmlStreamAttribute>).size;
    do {
      pDVar2 = (b->m_name).m_string.d;
      pQVar1[lVar3].m_name.m_string.d = pDVar2;
      pQVar1[lVar3].m_name.m_string.ptr = (b->m_name).m_string.ptr;
      pQVar1[lVar3].m_name.m_string.size = (b->m_name).m_string.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pDVar2 = (b->m_namespaceUri).m_string.d;
      pQVar1[lVar3].m_namespaceUri.m_string.d = pDVar2;
      pQVar1[lVar3].m_namespaceUri.m_string.ptr = (b->m_namespaceUri).m_string.ptr;
      pQVar1[lVar3].m_namespaceUri.m_string.size = (b->m_namespaceUri).m_string.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->m_qualifiedName).m_string.d;
      pQVar1[lVar3].m_qualifiedName.m_string.d = pDVar2;
      pQVar1[lVar3].m_qualifiedName.m_string.ptr = (b->m_qualifiedName).m_string.ptr;
      pQVar1[lVar3].m_qualifiedName.m_string.size = (b->m_qualifiedName).m_string.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->m_value).m_string.d;
      pQVar1[lVar3].m_value.m_string.d = pDVar2;
      pQVar1[lVar3].m_value.m_string.ptr = (b->m_value).m_string.ptr;
      pQVar1[lVar3].m_value.m_string.size = (b->m_value).m_string.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar1[lVar3].field_0x60 = pQVar1[lVar3].field_0x60 & 0xfe | b->field_0x60 & 1;
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<QXmlStreamAttribute>).size + 1;
      (this->super_QArrayDataPointer<QXmlStreamAttribute>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }